

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O2

bool P_LineOpening_3dMidtex(AActor *thing,line_t_conflict *linedef,FLineOpening *open,bool restrict)

{
  FTextureID tex;
  bool bVar1;
  WORD WVar2;
  double dVar3;
  double tb;
  double tt;
  double local_48;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  
  if (((linedef->flags & 0x10000000) == 0) ||
     ((((thing->flags).Value & 0x10000) == 0 && (((thing->BounceFlags).Value & 0x1000) == 0)))) {
    open->abovemidtex = false;
    bVar1 = P_GetMidTexturePosition(linedef,0,&local_40,&local_48);
    if (!bVar1) {
      return false;
    }
    dVar3 = (thing->__Pos).Z;
    if ((local_40 + local_48) * 0.5 <= thing->Height * 0.5 + dVar3) {
      if ((local_40 <= dVar3 || !restrict) && (open->bottom <= local_40 && local_40 != open->bottom)
         ) {
        open->bottom = local_40;
        open->abovemidtex = true;
        tex.texnum = linedef->sidedef[0]->textures[1].texture.texnum;
        (open->floorpic).texnum = tex.texnum;
        local_38 = local_40;
        uStack_30 = 0;
        WVar2 = FTerrainTypeArray::operator[](&TerrainTypes,tex);
        open->floorterrain = (uint)WVar2;
        (open->frontfloorplane).normal.X = 0.0;
        (open->frontfloorplane).normal.Y = 0.0;
        (open->frontfloorplane).normal.Z = 1.0;
        (open->frontfloorplane).negiC = -1.0;
        (open->frontfloorplane).D = -local_38;
        (open->backfloorplane).normal.X = 0.0;
        (open->backfloorplane).normal.Y = 0.0;
        (open->backfloorplane).normal.Z = 1.0;
        (open->backfloorplane).negiC = -1.0;
        (open->backfloorplane).D = -local_38;
        dVar3 = (thing->__Pos).Z;
        local_40 = local_38;
      }
      return ABS(dVar3 - local_40) <= thing->MaxStepHeight;
    }
    if (local_48 < open->top) {
      open->top = local_48;
      (open->ceilingpic).texnum = linedef->sidedef[0]->textures[1].texture.texnum;
    }
  }
  return false;
}

Assistant:

bool P_LineOpening_3dMidtex(AActor *thing, const line_t *linedef, FLineOpening &open, bool restrict)
{
	// [TP] Impassible-like 3dmidtextures do not block missiles
	if ((linedef->flags & ML_3DMIDTEX_IMPASS)
		&& (thing->flags & MF_MISSILE || thing->BounceFlags & BOUNCE_MBF))
	{
		return false;
	}

	double tt, tb;

	open.abovemidtex = false;
	if (P_GetMidTexturePosition(linedef, 0, &tt, &tb))
	{
		if (thing->Center() < (tt + tb)/2)
		{
			if (tb < open.top)
			{
				open.top = tb;
				open.ceilingpic = linedef->sidedef[0]->GetTexture(side_t::mid);
			}
		}
		else
		{
			if (tt > open.bottom && (!restrict || thing->Z() >= tt))
			{
				open.bottom = tt;
				open.abovemidtex = true;
				open.floorpic = linedef->sidedef[0]->GetTexture(side_t::mid);
				open.floorterrain = TerrainTypes[open.floorpic];
				open.frontfloorplane.SetAtHeight(tt, sector_t::floor);
				open.backfloorplane.SetAtHeight(tt, sector_t::floor);

			}
			// returns true if it touches the midtexture
			return (fabs(thing->Z() - tt) <= thing->MaxStepHeight);
		}
	}
	return false;

	/* still have to figure out what this code from Eternity means...
	if((linedef->flags & ML_BLOCKMONSTERS) && 
		!(mo->flags & (MF_FLOAT | MF_DROPOFF)) &&
		fabs(mo->Z() - tt) <= 24)
	{
		opentop = openbottom;
		openrange = 0;
		return;
	}
	*/
}